

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int print_regmat_cnt(char *fn)

{
  int32 iVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  uint32 *veclen;
  uint32 n_feat;
  uint32 n_mllr_class;
  float32 ***regr;
  float32 ****regl;
  
  iVar1 = read_reg_mat(fn,&veclen,&n_mllr_class,&n_feat,&regl,&regr);
  if (iVar1 == 0) {
    for (uVar6 = 0; uVar6 < n_mllr_class; uVar6 = uVar6 + 1) {
      for (uVar7 = 0; uVar7 < n_feat; uVar7 = uVar7 + 1) {
        printf("%d\n",(ulong)veclen[uVar7]);
        uVar5 = 0;
        while( true ) {
          uVar3 = (ulong)veclen[uVar7];
          if (uVar3 <= uVar5) break;
          for (uVar8 = 0; uVar8 < uVar3; uVar8 = uVar8 + 1) {
            printf("%f ",(double)(float)regl[uVar6][uVar7][uVar5][uVar8]);
            uVar3 = (ulong)veclen[uVar7];
          }
          putchar(10);
          uVar5 = uVar5 + 1;
        }
        for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
          printf("%f ",(double)(float)regr[uVar6][uVar7][uVar5]);
          uVar3 = (ulong)veclen[uVar7];
        }
        putchar(10);
        for (uVar4 = 0; uVar4 < veclen[uVar7]; uVar4 = uVar4 + 1) {
          printf("1.0 ");
        }
        putchar(10);
      }
    }
    ckd_free(veclen);
    free_mllr_reg(&regl,&regr,n_mllr_class,n_feat);
    iVar2 = 0;
  }
  else {
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int
print_regmat_cnt(const char *fn)
{
    float32 ****regl;
    float32 ***regr;
    uint32 n_mllr_class;
    uint32 n_feat;
    uint32 *veclen;
    uint32 c, f, j, k;

    if (read_reg_mat (fn, &veclen, &n_mllr_class, &n_feat, &regl, &regr) != S3_SUCCESS) {
	return S3_ERROR;
    }

    for (c = 0; c < n_mllr_class; c++) {
	for (f = 0; f < n_feat; f++) {
	    printf("%d\n", veclen[f]); 
	    for (j = 0; j < veclen[f]; j++) {
		for (k = 0; k < veclen[f]; ++k) {
		    printf("%f ", regl[c][f][j][k]);
		}
		printf("\n");
	    }
	    for (j = 0; j < veclen[f]; j++) {
		printf("%f ", regr[c][f][j]);
	    }
	    printf("\n");
	    /* Identity transform for variances. */
	    for (j = 0; j < veclen[f]; j++) {
		printf("1.0 ");
	    }
	    printf("\n");
	}
    }
    ckd_free(veclen);

    free_mllr_reg(&regl, &regr, n_mllr_class, n_feat);

    return S3_SUCCESS;
}